

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

void layout_objmenu(gamewin *gw)

{
  _func_void_gamewin_ptr *p_Var1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  char weightstr [16];
  char local_48 [24];
  
  iVar2 = _COLS;
  iVar6 = _LINES;
  *(undefined4 *)((long)&gw[2].resize + 4) = 2;
  if ((gw[1].next != (gamewin *)0x0) && (*(char *)&(gw[1].next)->draw != '\0')) {
    *(undefined4 *)((long)&gw[2].resize + 4) = 4;
  }
  iVar8 = *(int *)&gw[1].prev;
  iVar9 = *(int *)((long)&gw[2].resize + 4);
  iVar5 = 0x34;
  if (iVar8 < 0x34) {
    iVar5 = iVar8;
  }
  iVar5 = iVar5 + iVar9;
  if (iVar6 <= iVar5) {
    iVar5 = iVar6;
  }
  *(int *)&gw[2].resize = iVar5;
  *(int *)&gw[2].win = iVar5 - iVar9;
  if (iVar8 < 1) {
    iVar6 = 0;
  }
  else {
    lVar7 = 0;
    lVar4 = 0;
    iVar6 = 0;
    do {
      p_Var1 = gw[1].resize;
      sVar3 = strlen((char *)(p_Var1 + lVar7));
      iVar8 = (int)sVar3 + 2;
      if (*(int *)(p_Var1 + lVar7 + 0x104) != 1) {
        iVar8 = (int)sVar3;
      }
      if ((settings.invweight != '\0') && (*(int *)(p_Var1 + lVar7 + 0x118) != -1)) {
        sprintf(local_48," {%d}");
        sVar3 = strlen(local_48);
        iVar8 = iVar8 + (int)sVar3;
      }
      p_Var1 = gw[1].resize;
      iVar9 = iVar8;
      if ((*(int *)(p_Var1 + lVar7 + 0x104) == 1) &&
         (iVar9 = iVar8 + 4, p_Var1[lVar7 + 0x120] == (_func_void_gamewin_ptr)0x0)) {
        iVar9 = iVar8;
      }
      iVar8 = iVar9;
      if ((*(int *)(p_Var1 + lVar7 + 0x104) == 2) &&
         (iVar8 = iVar9 + 7, p_Var1[lVar7 + 0x121] == (_func_void_gamewin_ptr)0x0)) {
        iVar8 = iVar9;
      }
      if (iVar6 <= iVar8) {
        iVar6 = iVar8;
      }
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0x124;
    } while (lVar4 < *(int *)&gw[1].prev);
  }
  iVar8 = iVar2 + -4;
  if (iVar6 < iVar2 + -4) {
    iVar8 = iVar6;
  }
  *(int *)&gw[2].next = iVar8;
  *(int *)((long)&gw[2].win + 4) = iVar8 + 4;
  if ((gw[1].next != (gamewin *)0x0) &&
     (sVar3 = strlen((char *)gw[1].next), (ulong)(long)(iVar8 + 4) < sVar3 + 4)) {
    *(int *)&gw[2].next = (int)sVar3;
    *(int *)((long)&gw[2].win + 4) = (int)sVar3 + 4;
  }
  return;
}

Assistant:

static void layout_objmenu(struct gamewin *gw)
{
    struct win_objmenu *mdat = (struct win_objmenu*)gw->extra;
    char weightstr[16];
    int i, maxwidth, itemwidth;
    int scrheight = LINES;
    int scrwidth = COLS;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    maxwidth = 0;
    for (i = 0; i < mdat->icount; i++) {
	itemwidth = strlen(mdat->items[i].caption);
	
	/* add extra space for an object symbol */
	if (mdat->items[i].role == MI_NORMAL)
	    itemwidth += 2;
	
	/* if the weight is known, leave space to show it */
	if (settings.invweight && mdat->items[i].weight != -1) {
	    sprintf(weightstr, " {%d}", mdat->items[i].weight);
	    itemwidth += strlen(weightstr);
	}
	if (mdat->items[i].role == MI_NORMAL && mdat->items[i].accel)
	    itemwidth += 4; /* "a - " */
	if (mdat->items[i].role == MI_HEADING && mdat->items[i].group_accel)
	    itemwidth += 7; /* "  (')')" */
	maxwidth = max(maxwidth, itemwidth);
    }
    
    mdat->innerwidth = maxwidth;
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}